

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazyARA.cpp
# Opt level: O2

void __thiscall LazyARAPlanner::~LazyARAPlanner(LazyARAPlanner *this)

{
  (this->super_SBPLPlanner)._vptr_SBPLPlanner = (_func_int **)&PTR_replan_0015f810;
  freeMemory(this);
  std::_Vector_base<PlannerStats,_std::allocator<PlannerStats>_>::~_Vector_base
            (&(this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>);
  std::_Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>::~_Vector_base
            (&(this->states).super__Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>);
  std::_Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>::~_Vector_base
            (&(this->incons).super__Vector_base<LazyARAState_*,_std::allocator<LazyARAState_*>_>);
  CHeap::~CHeap(&this->heap);
  return;
}

Assistant:

LazyARAPlanner::~LazyARAPlanner()
{
    freeMemory();
}